

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O1

void __thiscall HPack::FieldLookupTable::evictEntry(FieldLookupTable *this)

{
  HeaderField *pHVar1;
  const_reference pvVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<HPack::FieldLookupTable::SearchEntry>,_std::_Rb_tree_iterator<HPack::FieldLookupTable::SearchEntry>_>
  pVar6;
  key_type local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->nDynamic != 0) {
    if (this->useIndex == true) {
      pHVar1 = back(this);
      uVar5 = this->end - 1;
      pvVar2 = std::
               deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
               ::operator[](&this->chunks,(ulong)(uVar5 >> 4));
      local_48.chunk =
           (pvVar2->_M_t).
           super___uniq_ptr_impl<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>
           .
           super__Head_base<0UL,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_*,_false>
           ._M_head_impl;
      local_48.field = pHVar1;
      local_48.offset = uVar5 & 0xf;
      local_48.table = this;
      pVar6 = std::
              _Rb_tree<HPack::FieldLookupTable::SearchEntry,_HPack::FieldLookupTable::SearchEntry,_std::_Identity<HPack::FieldLookupTable::SearchEntry>,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
              ::equal_range(&(this->searchIndex)._M_t,&local_48);
      std::
      _Rb_tree<HPack::FieldLookupTable::SearchEntry,_HPack::FieldLookupTable::SearchEntry,_std::_Identity<HPack::FieldLookupTable::SearchEntry>,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
      ::_M_erase_aux(&(this->searchIndex)._M_t,(_Base_ptr)pVar6.first._M_node,
                     (_Base_ptr)pVar6.second._M_node);
    }
    pHVar1 = back(this);
    uVar3 = (pHVar1->value).d.size + (pHVar1->name).d.size;
    iVar4 = 0;
    if (uVar3 >> 5 < 0x7ffffff) {
      iVar4 = (int)uVar3 + 0x20;
    }
    this->dataSize = this->dataSize - iVar4;
    this->nDynamic = this->nDynamic - 1;
    uVar5 = this->end - 1;
    this->end = uVar5;
    if (uVar5 == this->begin) {
      this->begin = 0x10;
      this->end = 0x10;
    }
    else if ((uVar5 & 0xf) == 0) {
      std::
      deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
      ::pop_back(&this->chunks);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FieldLookupTable::evictEntry()
{
    if (!nDynamic)
        return;

    Q_ASSERT(end != begin);

    if (useIndex) {
        const auto res = searchIndex.erase(backKey());
        Q_UNUSED(res);
        Q_ASSERT(res == 1);
    }

    const HeaderField &field = back();
    const auto entrySize = entry_size(field);
    Q_ASSERT(entrySize.first);
    Q_ASSERT(dataSize >= entrySize.second);
    dataSize -= entrySize.second;

    --nDynamic;
    --end;

    if (end == begin) {
        Q_ASSERT(chunks.size() == 1);
        end = ChunkSize;
        begin = end;
    } else if (!(end % ChunkSize)) {
        chunks.pop_back();
    }
}